

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NodePrintLevel(FILE *pFile,Abc_Obj_t *pNode)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *p;
  Abc_Obj_t *local_30;
  Vec_Ptr_t *vNodes;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pNode_local;
  FILE *pFile_local;
  
  pDriver = pNode;
  pNode_local = (Abc_Obj_t *)pFile;
  iVar2 = Abc_ObjIsCo(pNode);
  if (iVar2 == 0) {
    local_30 = pDriver;
  }
  else {
    local_30 = Abc_ObjFanin0(pDriver);
  }
  vNodes = (Vec_Ptr_t *)local_30;
  iVar2 = Abc_ObjIsPi(local_30);
  if (iVar2 == 0) {
    iVar2 = Abc_ObjIsLatch((Abc_Obj_t *)vNodes);
    if (iVar2 == 0) {
      iVar2 = Abc_NodeIsConst((Abc_Obj_t *)vNodes);
      pAVar1 = pNode_local;
      if (iVar2 == 0) {
        fprintf((FILE *)pNode_local,"Level = %3d.  ",(ulong)((uint)vNodes[1].nSize >> 0xc));
        pAVar1 = pNode_local;
        uVar3 = Abc_NodeMffcSize((Abc_Obj_t *)vNodes);
        fprintf((FILE *)pAVar1,"Mffc = %5d.  ",(ulong)uVar3);
        p = Abc_NtkDfsNodes(pDriver->pNtk,(Abc_Obj_t **)&vNodes,1);
        pAVar1 = pNode_local;
        uVar3 = Vec_PtrSize(p);
        fprintf((FILE *)pAVar1,"Cone = %5d.  ",(ulong)uVar3);
        Vec_PtrFree(p);
        fprintf((FILE *)pNode_local,"\n");
      }
      else {
        iVar2 = Abc_ObjFaninC0(pDriver);
        fprintf((FILE *)pAVar1,"Constant %d.\n",(ulong)((iVar2 != 0 ^ 0xffU) & 1));
      }
    }
    else {
      fprintf((FILE *)pNode_local,"Latch.\n");
    }
  }
  else {
    fprintf((FILE *)pNode_local,"Primary input.\n");
  }
  return;
}

Assistant:

void Abc_NodePrintLevel( FILE * pFile, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pDriver;
    Vec_Ptr_t * vNodes;

    pDriver = Abc_ObjIsCo(pNode)? Abc_ObjFanin0(pNode) : pNode;
    if ( Abc_ObjIsPi(pDriver) )
    {
        fprintf( pFile, "Primary input.\n" );
        return;
    }
    if ( Abc_ObjIsLatch(pDriver) )
    {
        fprintf( pFile, "Latch.\n" );
        return;
    }
    if ( Abc_NodeIsConst(pDriver) )
    {
        fprintf( pFile, "Constant %d.\n", !Abc_ObjFaninC0(pNode) );
        return;
    }
    // print the level
    fprintf( pFile, "Level = %3d.  ", pDriver->Level );
    // print the size of MFFC
    fprintf( pFile, "Mffc = %5d.  ", Abc_NodeMffcSize(pDriver) );
    // print the size of the shole cone
    vNodes = Abc_NtkDfsNodes( pNode->pNtk, &pDriver, 1 );
    fprintf( pFile, "Cone = %5d.  ", Vec_PtrSize(vNodes) );
    Vec_PtrFree( vNodes );
    fprintf( pFile, "\n" );
}